

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_padding.cpp
# Opt level: O1

int32_t __thiscall
icu_63::number::impl::Padder::padAndApply
          (Padder *this,Modifier *mod1,Modifier *mod2,NumberStringBuilder *string,int32_t leftIndex,
          int32_t rightIndex,UErrorCode *status)

{
  uint codePoint;
  UNumberFormatPadPosition UVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar2 = (*mod1->_vptr_Modifier[4])(mod1);
  iVar3 = (*mod2->_vptr_Modifier[4])(mod2);
  iVar8 = this->fWidth;
  iVar4 = NumberStringBuilder::codePointCount(string);
  iVar3 = iVar3 + iVar2 + iVar4;
  iVar2 = iVar8 - iVar3;
  if (iVar2 < 1) {
    iVar8 = (*mod1->_vptr_Modifier[2])(mod1,string,(ulong)(uint)leftIndex,rightIndex,status);
    iVar2 = (*mod2->_vptr_Modifier[2])
                      (mod2,string,(ulong)(uint)leftIndex,(ulong)(uint)(rightIndex + iVar8),status);
    return iVar2 + iVar8;
  }
  codePoint = (this->fUnion).padding.fCp;
  UVar1 = (this->fUnion).padding.fPosition;
  iVar7 = iVar2;
  if (UVar1 == UNUM_PAD_AFTER_PREFIX) {
    do {
      NumberStringBuilder::insertCodePoint(string,leftIndex,codePoint,UNUM_FIELD_COUNT,status);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  else {
    iVar6 = 0;
    if (UVar1 != UNUM_PAD_BEFORE_SUFFIX) goto LAB_0026551d;
    do {
      NumberStringBuilder::insertCodePoint(string,rightIndex,codePoint,UNUM_FIELD_COUNT,status);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  iVar6 = iVar2 << (0xffff < codePoint);
LAB_0026551d:
  iVar7 = (*mod1->_vptr_Modifier[2])
                    (mod1,string,(ulong)(uint)leftIndex,(ulong)(uint)(iVar6 + rightIndex),status);
  iVar5 = (*mod2->_vptr_Modifier[2])
                    (mod2,string,(ulong)(uint)leftIndex,(ulong)(uint)(rightIndex + iVar7 + iVar6),
                     status);
  iVar5 = iVar5 + iVar7 + iVar6;
  if (UVar1 == UNUM_PAD_AFTER_SUFFIX) {
    iVar8 = iVar2;
    do {
      NumberStringBuilder::insertCodePoint
                (string,rightIndex + iVar5,codePoint,UNUM_FIELD_COUNT,status);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  else {
    if (UVar1 != UNUM_PAD_BEFORE_PREFIX) {
      return iVar5;
    }
    iVar8 = iVar8 - iVar3;
    do {
      NumberStringBuilder::insertCodePoint(string,leftIndex,codePoint,UNUM_FIELD_COUNT,status);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  return iVar5 + (iVar2 << (0xffff < codePoint));
}

Assistant:

int32_t Padder::padAndApply(const Modifier &mod1, const Modifier &mod2,
                            NumberStringBuilder &string, int32_t leftIndex, int32_t rightIndex,
                            UErrorCode &status) const {
    int32_t modLength = mod1.getCodePointCount() + mod2.getCodePointCount();
    int32_t requiredPadding = fWidth - modLength - string.codePointCount();
    U_ASSERT(leftIndex == 0 &&
             rightIndex == string.length()); // fix the previous line to remove this assertion

    int length = 0;
    if (requiredPadding <= 0) {
        // Padding is not required.
        length += mod1.apply(string, leftIndex, rightIndex, status);
        length += mod2.apply(string, leftIndex, rightIndex + length, status);
        return length;
    }

    PadPosition position = fUnion.padding.fPosition;
    UChar32 paddingCp = fUnion.padding.fCp;
    if (position == UNUM_PAD_AFTER_PREFIX) {
        length += addPaddingHelper(paddingCp, requiredPadding, string, leftIndex, status);
    } else if (position == UNUM_PAD_BEFORE_SUFFIX) {
        length += addPaddingHelper(paddingCp, requiredPadding, string, rightIndex + length, status);
    }
    length += mod1.apply(string, leftIndex, rightIndex + length, status);
    length += mod2.apply(string, leftIndex, rightIndex + length, status);
    if (position == UNUM_PAD_BEFORE_PREFIX) {
        length += addPaddingHelper(paddingCp, requiredPadding, string, leftIndex, status);
    } else if (position == UNUM_PAD_AFTER_SUFFIX) {
        length += addPaddingHelper(paddingCp, requiredPadding, string, rightIndex + length, status);
    }

    return length;
}